

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O3

void __thiscall
Fir1::initWithVector(Fir1 *this,vector<double,_std::allocator<double>_> *_coefficients)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  double *pdVar4;
  double *__s;
  long lVar5;
  ulong uVar6;
  
  pdVar1 = (_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)pdVar2 - (long)pdVar1;
  uVar6 = (long)uVar3 >> 3;
  uVar3 = -(ulong)(uVar6 >> 0x3d != 0) | uVar3;
  pdVar4 = (double *)operator_new__(uVar3);
  this->coefficients = pdVar4;
  __s = (double *)operator_new__(uVar3);
  memset(__s,0,uVar3);
  this->buffer = __s;
  this->taps = (uint)uVar6;
  if (pdVar2 != pdVar1) {
    lVar5 = 0;
    do {
      pdVar4[lVar5] = pdVar1[lVar5];
      __s[lVar5] = 0.0;
      lVar5 = lVar5 + 1;
    } while (uVar6 + (uVar6 == 0) != lVar5);
  }
  return;
}

Assistant:

void Fir1::initWithVector(std::vector<double> _coefficients) {
	coefficients = new double[_coefficients.size()];
	buffer = new double[_coefficients.size()]();
	taps = ((unsigned int)_coefficients.size());
	for(unsigned long i=0;i<_coefficients.size();i++) {
		coefficients[i] = _coefficients[i];
		buffer[i] = 0;
	}
}